

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O1

void satoko_assump_pop(solver_t *s)

{
  vec_uint_t *pvVar1;
  uint level;
  
  pvVar1 = s->assumptions;
  if (pvVar1->size == 0) {
    __assert_fail("vec_uint_size(s->assumptions) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver_api.c"
                  ,0x134,"void satoko_assump_pop(solver_t *)");
  }
  if (pvVar1 != (vec_uint_t *)0x0) {
    level = pvVar1->size - 1;
    pvVar1->size = level;
    solver_cancel_until(s,level);
    return;
  }
  __assert_fail("p && p->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                ,0xbc,"unsigned int vec_uint_pop_back(vec_uint_t *)");
}

Assistant:

void satoko_assump_pop(solver_t *s)
{
    assert(vec_uint_size(s->assumptions) > 0);
    // printf("[Satoko] Pop assumption: %d\n", vec_uint_pop_back(s->assumptions));
    vec_uint_pop_back(s->assumptions);
    solver_cancel_until(s, vec_uint_size(s->assumptions));
}